

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong __n;
  bool bVar1;
  ulong uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = false;
  uStack_c0 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              ::find(str,replaceThis,0);
  while (__n = uStack_c0, __n != 0xffffffffffffffff) {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_b0,str,0,__n);
    std::operator+(&local_90,&local_b0,withThis);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,str,replaceThis->_M_string_length + __n,0xffffffffffffffff);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar1 = true;
    uStack_c0 = 0xffffffffffffffff;
    if (__n < str->_M_string_length - withThis->_M_string_length) {
      uStack_c0 = clara::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            (str,replaceThis,withThis->_M_string_length + __n);
    }
  }
  return bVar1;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }